

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O1

void opl_set_mute_mask(void *chip,UINT32 MuteMask)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (long)chip + 0xdd;
  lVar2 = 0;
  do {
    *(bool *)lVar1 = (MuteMask >> ((uint)lVar2 & 0x1f) & 1) != 0;
    lVar2 = lVar2 + 1;
    lVar1 = lVar1 + 0xc0;
  } while (lVar2 != 9);
  lVar1 = 0;
  do {
    *(bool *)((long)chip + lVar1 + 0x6e0) = (MuteMask >> ((int)lVar1 + 9U & 0x1f) & 1) != 0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 6);
  return;
}

Assistant:

void opl_set_mute_mask(void *chip, UINT32 MuteMask)
{
	FM_OPL *opl = (FM_OPL *)chip;
	UINT8 CurChn;
	
	for (CurChn = 0; CurChn < 9; CurChn ++)
		opl->P_CH[CurChn].Muted = (MuteMask >> CurChn) & 0x01;
	for (CurChn = 0; CurChn < 6; CurChn ++)
		opl->MuteSpc[CurChn] = (MuteMask >> (9 + CurChn)) & 0x01;
	
	return;
}